

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Interaction * __thiscall
pbrt::Transform::ApplyInverse(Interaction *__return_storage_ptr__,Transform *this,Interaction *in)

{
  undefined8 uVar1;
  type tVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  Normal3<float> NVar12;
  Vector3<float> VVar13;
  Transform t;
  Transform local_98;
  undefined1 auVar8 [56];
  undefined1 auVar10 [60];
  
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (__return_storage_ptr__->uv).super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
  (__return_storage_ptr__->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
  (__return_storage_ptr__->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
  (__return_storage_ptr__->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
  (__return_storage_ptr__->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = 0.0;
  (__return_storage_ptr__->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = 0.0;
  (__return_storage_ptr__->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = 0.0;
  __return_storage_ptr__->time = 0.0;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  __return_storage_ptr__->mediumInterface = (MediumInterface *)SUB168(ZEXT416(0) << 0x40,0);
  __return_storage_ptr__->medium = (MediumHandle)SUB168(ZEXT416(0) << 0x40,8);
  local_98.m.m[0]._0_8_ = *(undefined8 *)(this->mInv).m[0];
  local_98.m.m[0]._8_8_ = *(undefined8 *)((this->mInv).m[0] + 2);
  local_98.m.m[1]._0_8_ = *(undefined8 *)(this->mInv).m[1];
  local_98.m.m[1]._8_8_ = *(undefined8 *)((this->mInv).m[1] + 2);
  local_98.m.m[2]._0_8_ = *(undefined8 *)(this->mInv).m[2];
  local_98.m.m[2]._8_8_ = *(undefined8 *)((this->mInv).m[2] + 2);
  local_98.m.m[3]._0_8_ = *(undefined8 *)(this->mInv).m[3];
  local_98.m.m[3]._8_8_ = *(undefined8 *)((this->mInv).m[3] + 2);
  local_98.mInv.m[0]._0_8_ = *(undefined8 *)(this->m).m[0];
  local_98.mInv.m[0]._8_8_ = *(undefined8 *)((this->m).m[0] + 2);
  local_98.mInv.m[1]._0_8_ = *(undefined8 *)(this->m).m[1];
  local_98.mInv.m[1]._8_8_ = *(undefined8 *)((this->m).m[1] + 2);
  local_98.mInv.m[2]._0_8_ = *(undefined8 *)(this->m).m[2];
  local_98.mInv.m[2]._8_8_ = *(undefined8 *)((this->m).m[2] + 2);
  local_98.mInv.m[3]._0_8_ = *(undefined8 *)(this->m).m[3];
  local_98.mInv.m[3]._8_8_ = *(undefined8 *)((this->m).m[3] + 2);
  auVar8 = ZEXT856((ulong)local_98.mInv.m[0]._8_8_);
  operator()(&__return_storage_ptr__->pi,&local_98,&in->pi);
  NVar12 = operator()(&local_98,&in->n);
  auVar4._0_8_ = NVar12.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar4._8_56_ = auVar8;
  uVar1 = vmovlps_avx(auVar4._0_16_);
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z =
       NVar12.super_Tuple3<pbrt::Normal3,_float>.z;
  tVar2 = LengthSquared<float>(&__return_storage_ptr__->n);
  auVar10 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
  auVar8 = extraout_var;
  if (0.0 < tVar2) {
    NVar12 = Normalize<float>(&__return_storage_ptr__->n);
    auVar5._0_8_ = NVar12.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar5._8_56_ = auVar8;
    uVar1 = vmovlps_avx(auVar5._0_16_);
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z =
         NVar12.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  (__return_storage_ptr__->uv).super_Tuple2<pbrt::Point2,_float> =
       (in->uv).super_Tuple2<pbrt::Point2,_float>;
  VVar13 = operator()(&local_98,&in->wo);
  auVar9._0_4_ = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._4_60_ = auVar10;
  auVar6._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar8;
  auVar3 = auVar6._0_16_;
  auVar11._0_4_ =
       VVar13.super_Tuple3<pbrt::Vector3,_float>.x * VVar13.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar11._4_4_ =
       VVar13.super_Tuple3<pbrt::Vector3,_float>.y * VVar13.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar11._8_4_ = auVar8._0_4_ * auVar8._0_4_;
  auVar11._12_4_ = auVar8._4_4_ * auVar8._4_4_;
  uVar1 = vmovlps_avx(auVar3);
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = auVar9._0_4_;
  auVar11 = vmovshdup_avx(auVar11);
  auVar11 = vfmadd231ss_fma(auVar11,auVar3,auVar3);
  auVar11 = vfmadd231ss_fma(auVar11,auVar9._0_16_,auVar9._0_16_);
  if (0.0 < auVar11._0_4_) {
    VVar13 = Normalize<float>(&__return_storage_ptr__->wo);
    auVar7._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar8;
    uVar1 = vmovlps_avx(auVar7._0_16_);
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z =
         VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  __return_storage_ptr__->time = in->time;
  __return_storage_ptr__->mediumInterface = in->mediumInterface;
  return __return_storage_ptr__;
}

Assistant:

Interaction Transform::ApplyInverse(const Interaction &in) const {
    Interaction ret;
    Transform t = Inverse(*this);
    ret.pi = t(in.pi);
    ret.n = t(in.n);
    if (LengthSquared(ret.n) > 0)
        ret.n = Normalize(ret.n);
    ret.uv = in.uv;
    ret.wo = t(in.wo);
    if (LengthSquared(ret.wo) > 0)
        ret.wo = Normalize(ret.wo);
    ret.time = in.time;
    ret.mediumInterface = in.mediumInterface;
    return ret;
}